

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::Hashing::compute_hash_graphics_pipeline
               (StateRecorder *recorder,VkGraphicsPipelineCreateInfo *create_info,Hash *out_hash)

{
  VkSampleCountFlagBits VVar1;
  VkPipelineDynamicStateCreateInfo *pVVar2;
  VkPipelineDepthStencilStateCreateInfo *pVVar3;
  VkPipelineInputAssemblyStateCreateInfo *pVVar4;
  VkPipelineRasterizationStateCreateInfo *pVVar5;
  VkPipelineMultisampleStateCreateInfo *pVVar6;
  VkPipelineViewportStateCreateInfo *pVVar7;
  VkPipelineVertexInputStateCreateInfo *pVVar8;
  VkPipelineColorBlendStateCreateInfo *pVVar9;
  VkPipelineTessellationStateCreateInfo *pVVar10;
  bool bVar11;
  VkPipelineCreateFlags2CreateInfo *pVVar12;
  VkPipelineCreateFlags2KHR VVar13;
  Hash HVar14;
  bool bVar15;
  GlobalStateInfo GVar16;
  uint32_t local_230;
  VkBlendOp local_22c;
  VkBlendOp local_228;
  uint32_t local_224;
  uint32_t local_220;
  byte local_219;
  VkLogicOp local_218;
  uint32_t local_214;
  uint32_t local_210;
  uint32_t local_20c;
  uint32_t local_208;
  VkSampleCountFlagBits local_204;
  uint32_t local_200;
  uint32_t local_1fc;
  uint32_t local_1f8;
  VkPolygonMode local_1f4;
  uint32_t local_1f0;
  VkFrontFace local_1ec;
  uint32_t local_1e8;
  uint32_t local_1e4;
  uint32_t local_1e0;
  uint32_t local_1dc;
  VkStencilOp local_1d8;
  VkStencilOp local_1d4;
  VkStencilOp local_1d0;
  VkCompareOp local_1cc;
  VkStencilOp local_1c8;
  VkStencilOp local_1c4;
  VkStencilOp local_1c0;
  VkCompareOp local_1bc;
  uint32_t local_1b8;
  uint32_t local_1b4;
  VkCompareOp local_1b0;
  uint32_t local_1ac;
  uint32_t local_1a8;
  uint32_t local_1a4;
  VkPipelineShaderStageCreateInfo *stage;
  uint32_t i_7;
  VkPipelineTessellationStateCreateInfo *tess;
  float *blend_const;
  float *__end4;
  float *__begin4;
  float (*__range4) [4];
  uint32_t i_6;
  bool dynamic_attachments;
  bool need_blend_constants;
  VkPipelineColorBlendStateCreateInfo *b;
  uint32_t i_5;
  uint32_t i_4;
  VkPipelineVertexInputStateCreateInfo *vi;
  uint32_t i_3;
  uint32_t i_2;
  VkPipelineViewportStateCreateInfo *vp;
  uint32_t i_1;
  uint32_t elems;
  VkPipelineMultisampleStateCreateInfo *ms;
  VkPipelineRasterizationStateCreateInfo *rs;
  VkPipelineInputAssemblyStateCreateInfo *ia;
  VkPipelineDepthStencilStateCreateInfo *ds;
  uint32_t i;
  VkPipelineDynamicStateCreateInfo *state;
  SubpassMeta local_e2;
  undefined8 uStack_e0;
  SubpassMeta meta;
  SubpassMeta local_cd;
  ulong local_cb;
  GlobalStateInfo global_info;
  undefined1 local_80 [8];
  DynamicStateInfo dynamic_info;
  Hash hash;
  Hasher h;
  VkGraphicsPipelineLibraryFlagsEXT state_flags;
  Hash *out_hash_local;
  VkGraphicsPipelineCreateInfo *create_info_local;
  StateRecorder *recorder_local;
  
  h.h._4_4_ = graphics_pipeline_get_effective_state_flags(create_info);
  Hasher::Hasher((Hasher *)&hash);
  pVVar12 = find_pnext<VkPipelineCreateFlags2CreateInfo>
                      (VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO,create_info->pNext);
  if (pVVar12 == (VkPipelineCreateFlags2CreateInfo *)0x0) {
    VVar13 = normalize_pipeline_creation_flags((ulong)create_info->flags);
    Hasher::u32((Hasher *)&hash,(uint32_t)VVar13);
  }
  else {
    Hasher::u32((Hasher *)&hash,0);
  }
  if (((create_info->flags & 4) != 0) && (create_info->basePipelineHandle != (VkPipeline)0x0)) {
    bVar11 = StateRecorder::get_hash_for_graphics_pipeline_handle
                       (recorder,create_info->basePipelineHandle,
                        (Hash *)&dynamic_info.coverage_to_color_location);
    if (!bVar11) {
      return false;
    }
    Hasher::u64((Hasher *)&hash,dynamic_info._56_8_);
    Hasher::s32((Hasher *)&hash,create_info->basePipelineIndex);
  }
  memset(local_80,0,0x40);
  if (create_info->pDynamicState != (VkPipelineDynamicStateCreateInfo *)0x0) {
    parse_dynamic_state_info
              ((DynamicStateInfo *)&global_info.multisample_state,create_info->pDynamicState);
    memcpy(local_80,&global_info.multisample_state,0x40);
  }
  local_cd.uses_color = true;
  local_cd.uses_depth_stencil = true;
  GVar16 = parse_global_state_info(create_info,(DynamicStateInfo *)local_80,&local_cd);
  uStack_e0 = GVar16._0_8_;
  global_info._0_2_ = GVar16._8_2_;
  global_info.viewport_state = GVar16.module_state;
  local_cb = uStack_e0;
  if (((undefined1  [11])GVar16 & (undefined1  [11])0x100) == (undefined1  [11])0x0) {
    dynamic_info.coverage_to_color_location = false;
    dynamic_info.coverage_modulation_mode = false;
    dynamic_info.coverage_modulation_table_enable = false;
    dynamic_info.coverage_modulation_table = false;
    dynamic_info.shading_rate_image_enable = false;
    dynamic_info.representative_fragment_test_enable = false;
    dynamic_info.coverage_reduction_mode = false;
    dynamic_info.depth_clamp_range = false;
  }
  else {
    bVar11 = StateRecorder::get_hash_for_pipeline_layout
                       (recorder,create_info->layout,
                        (Hash *)&dynamic_info.coverage_to_color_location);
    if (!bVar11) {
      return false;
    }
  }
  Hasher::u64((Hasher *)&hash,dynamic_info._56_8_);
  dynamic_info.coverage_to_color_location = false;
  dynamic_info.coverage_modulation_mode = false;
  dynamic_info.coverage_modulation_table_enable = false;
  dynamic_info.coverage_modulation_table = false;
  dynamic_info.shading_rate_image_enable = false;
  dynamic_info.representative_fragment_test_enable = false;
  dynamic_info.coverage_reduction_mode = false;
  dynamic_info.depth_clamp_range = false;
  if (((global_info._0_2_ & 1) == 0) ||
     (bVar11 = StateRecorder::get_hash_for_render_pass
                         (recorder,create_info->renderPass,
                          (Hash *)&dynamic_info.coverage_to_color_location), bVar11)) {
    Hasher::u64((Hasher *)&hash,dynamic_info._56_8_);
    memset(&local_e2,0,2);
    bVar11 = StateRecorder::get_subpass_meta_for_pipeline
                       (recorder,create_info,dynamic_info._56_8_,&local_e2);
    if (bVar11) {
      GVar16 = parse_global_state_info(create_info,(DynamicStateInfo *)local_80,&local_e2);
      local_cb = GVar16._0_8_;
      global_info._0_2_ = GVar16._8_2_;
      global_info.viewport_state = GVar16.module_state;
      if (((undefined1  [11])GVar16 & (undefined1  [11])0x1) == (undefined1  [11])0x0) {
        local_1a4 = 0;
      }
      else {
        local_1a4 = create_info->subpass;
      }
      Hasher::u32((Hasher *)&hash,local_1a4);
      if ((global_info.viewport_state & 1U) == 0) {
        local_1a8 = 0;
      }
      else {
        local_1a8 = create_info->stageCount;
      }
      Hasher::u32((Hasher *)&hash,local_1a8);
      if (create_info->pDynamicState == (VkPipelineDynamicStateCreateInfo *)0x0) {
        Hasher::u32((Hasher *)&hash,0);
      }
      else {
        pVVar2 = create_info->pDynamicState;
        Hasher::u32((Hasher *)&hash,pVVar2->dynamicStateCount);
        Hasher::u32((Hasher *)&hash,pVVar2->flags);
        for (ds._4_4_ = 0; ds._4_4_ < pVVar2->dynamicStateCount; ds._4_4_ = ds._4_4_ + 1) {
          Hasher::u32((Hasher *)&hash,pVVar2->pDynamicStates[ds._4_4_]);
        }
        bVar11 = hash_pnext_chain(recorder,(Hasher *)&hash,pVVar2->pNext,
                                  (DynamicStateInfo *)local_80,h.h._4_4_);
        if (!bVar11) {
          return false;
        }
      }
      if ((local_cb & 0x100000000) == 0) {
        Hasher::u32((Hasher *)&hash,0);
      }
      else {
        pVVar3 = create_info->pDepthStencilState;
        Hasher::u32((Hasher *)&hash,pVVar3->flags);
        if ((dynamic_info.viewport & 1U) == 0) {
          local_1ac = pVVar3->depthBoundsTestEnable;
        }
        else {
          local_1ac = 0;
        }
        Hasher::u32((Hasher *)&hash,local_1ac);
        if ((dynamic_info.scissor & 1U) == 0) {
          local_1b0 = pVVar3->depthCompareOp;
        }
        else {
          local_1b0 = VK_COMPARE_OP_NEVER;
        }
        Hasher::u32((Hasher *)&hash,local_1b0);
        if ((dynamic_info.line_width & 1U) == 0) {
          local_1b4 = pVVar3->depthTestEnable;
        }
        else {
          local_1b4 = 0;
        }
        Hasher::u32((Hasher *)&hash,local_1b4);
        if ((dynamic_info.blend_constants & 1U) == 0) {
          local_1b8 = pVVar3->depthWriteEnable;
        }
        else {
          local_1b8 = 0;
        }
        Hasher::u32((Hasher *)&hash,local_1b8);
        if ((dynamic_info.viewport_count & 1U) == 0) {
          local_1bc = (pVVar3->front).compareOp;
        }
        else {
          local_1bc = VK_COMPARE_OP_NEVER;
        }
        Hasher::u32((Hasher *)&hash,local_1bc);
        if ((dynamic_info.viewport_count & 1U) == 0) {
          local_1c0 = (pVVar3->front).depthFailOp;
        }
        else {
          local_1c0 = VK_STENCIL_OP_KEEP;
        }
        Hasher::u32((Hasher *)&hash,local_1c0);
        if ((dynamic_info.viewport_count & 1U) == 0) {
          local_1c4 = (pVVar3->front).failOp;
        }
        else {
          local_1c4 = VK_STENCIL_OP_KEEP;
        }
        Hasher::u32((Hasher *)&hash,local_1c4);
        if ((dynamic_info.viewport_count & 1U) == 0) {
          local_1c8 = (pVVar3->front).passOp;
        }
        else {
          local_1c8 = VK_STENCIL_OP_KEEP;
        }
        Hasher::u32((Hasher *)&hash,local_1c8);
        if ((dynamic_info.viewport_count & 1U) == 0) {
          local_1cc = (pVVar3->back).compareOp;
        }
        else {
          local_1cc = VK_COMPARE_OP_NEVER;
        }
        Hasher::u32((Hasher *)&hash,local_1cc);
        if ((dynamic_info.viewport_count & 1U) == 0) {
          local_1d0 = (pVVar3->back).depthFailOp;
        }
        else {
          local_1d0 = VK_STENCIL_OP_KEEP;
        }
        Hasher::u32((Hasher *)&hash,local_1d0);
        if ((dynamic_info.viewport_count & 1U) == 0) {
          local_1d4 = (pVVar3->back).failOp;
        }
        else {
          local_1d4 = VK_STENCIL_OP_KEEP;
        }
        Hasher::u32((Hasher *)&hash,local_1d4);
        if ((dynamic_info.viewport_count & 1U) == 0) {
          local_1d8 = (pVVar3->back).passOp;
        }
        else {
          local_1d8 = VK_STENCIL_OP_KEEP;
        }
        Hasher::u32((Hasher *)&hash,local_1d8);
        if ((dynamic_info.scissor_count & 1U) == 0) {
          local_1dc = pVVar3->stencilTestEnable;
        }
        else {
          local_1dc = 0;
        }
        Hasher::u32((Hasher *)&hash,local_1dc);
        if (((local_80[3] & 1U) == 0) &&
           ((pVVar3->depthBoundsTestEnable != 0 || ((dynamic_info.viewport & 1U) != 0)))) {
          Hasher::f32((Hasher *)&hash,pVVar3->minDepthBounds);
          Hasher::f32((Hasher *)&hash,pVVar3->maxDepthBounds);
        }
        if ((pVVar3->stencilTestEnable != 0) || ((dynamic_info.scissor_count & 1U) != 0)) {
          if ((local_80[0] & 1U) == 0) {
            Hasher::u32((Hasher *)&hash,(pVVar3->front).compareMask);
            Hasher::u32((Hasher *)&hash,(pVVar3->back).compareMask);
          }
          if ((local_80[1] & 1U) == 0) {
            Hasher::u32((Hasher *)&hash,(pVVar3->front).reference);
            Hasher::u32((Hasher *)&hash,(pVVar3->back).reference);
          }
          if ((local_80[2] & 1U) == 0) {
            Hasher::u32((Hasher *)&hash,(pVVar3->front).writeMask);
            Hasher::u32((Hasher *)&hash,(pVVar3->back).writeMask);
          }
        }
        bVar11 = hash_pnext_chain(recorder,(Hasher *)&hash,pVVar3->pNext,
                                  (DynamicStateInfo *)local_80,h.h._4_4_);
        if (!bVar11) {
          return false;
        }
      }
      if ((local_cb & 1) == 0) {
        Hasher::u32((Hasher *)&hash,0);
      }
      else {
        pVVar4 = create_info->pInputAssemblyState;
        Hasher::u32((Hasher *)&hash,pVVar4->flags);
        if ((dynamic_info.depth_compare_op & 1U) == 0) {
          local_1e0 = pVVar4->primitiveRestartEnable;
        }
        else {
          local_1e0 = 0;
        }
        Hasher::u32((Hasher *)&hash,local_1e0);
        Hasher::u32((Hasher *)&hash,pVVar4->topology);
        bVar11 = hash_pnext_chain(recorder,(Hasher *)&hash,pVVar4->pNext,
                                  (DynamicStateInfo *)local_80,h.h._4_4_);
        if (!bVar11) {
          return false;
        }
      }
      if ((local_cb & 0x100000000000000) == 0) {
        Hasher::u32((Hasher *)&hash,0);
      }
      else {
        pVVar5 = create_info->pRasterizationState;
        Hasher::u32((Hasher *)&hash,pVVar5->flags);
        if ((dynamic_info.depth_bounds & 1U) == 0) {
          local_1e4 = pVVar5->cullMode;
        }
        else {
          local_1e4 = 0;
        }
        Hasher::u32((Hasher *)&hash,local_1e4);
        if ((dynamic_info.color_write_enable & 1U) == 0) {
          local_1e8 = pVVar5->depthClampEnable;
        }
        else {
          local_1e8 = 0;
        }
        Hasher::u32((Hasher *)&hash,local_1e8);
        if ((dynamic_info.depth_bias & 1U) == 0) {
          local_1ec = pVVar5->frontFace;
        }
        else {
          local_1ec = VK_FRONT_FACE_COUNTER_CLOCKWISE;
        }
        Hasher::u32((Hasher *)&hash,local_1ec);
        if ((dynamic_info.depth_write_enable & 1U) == 0) {
          local_1f0 = pVVar5->rasterizerDiscardEnable;
        }
        else {
          local_1f0 = 0;
        }
        Hasher::u32((Hasher *)&hash,local_1f0);
        if ((dynamic_info.depth_bias_enable & 1U) == 0) {
          local_1f4 = pVVar5->polygonMode;
        }
        else {
          local_1f4 = VK_POLYGON_MODE_FILL;
        }
        Hasher::u32((Hasher *)&hash,local_1f4);
        if ((dynamic_info.stencil_op & 1U) == 0) {
          local_1f8 = pVVar5->depthBiasEnable;
        }
        else {
          local_1f8 = 0;
        }
        Hasher::u32((Hasher *)&hash,local_1f8);
        if (((pVVar5->depthBiasEnable != 0) || ((dynamic_info.stencil_op & 1U) != 0)) &&
           ((local_80[4] & 1U) == 0)) {
          Hasher::f32((Hasher *)&hash,pVVar5->depthBiasClamp);
          Hasher::f32((Hasher *)&hash,pVVar5->depthBiasSlopeFactor);
          Hasher::f32((Hasher *)&hash,pVVar5->depthBiasConstantFactor);
        }
        if ((local_80[5] & 1U) == 0) {
          Hasher::f32((Hasher *)&hash,pVVar5->lineWidth);
        }
        bVar11 = hash_pnext_chain(recorder,(Hasher *)&hash,pVVar5->pNext,
                                  (DynamicStateInfo *)local_80,h.h._4_4_);
        if (!bVar11) {
          return false;
        }
      }
      if ((local_cb & 0x1000000) != 0) {
        pVVar6 = create_info->pMultisampleState;
        Hasher::u32((Hasher *)&hash,pVVar6->flags);
        if ((dynamic_info.fragment_shading_rate & 1U) == 0) {
          local_1fc = pVVar6->alphaToCoverageEnable;
        }
        else {
          local_1fc = 0;
        }
        Hasher::u32((Hasher *)&hash,local_1fc);
        if ((dynamic_info.sample_locations & 1U) == 0) {
          local_200 = pVVar6->alphaToOneEnable;
        }
        else {
          local_200 = 0;
        }
        Hasher::u32((Hasher *)&hash,local_200);
        Hasher::f32((Hasher *)&hash,pVVar6->minSampleShading);
        if ((dynamic_info.discard_rectangle & 1U) == 0) {
          local_204 = pVVar6->rasterizationSamples;
        }
        else {
          local_204 = 0;
        }
        Hasher::u32((Hasher *)&hash,local_204);
        Hasher::u32((Hasher *)&hash,pVVar6->sampleShadingEnable);
        if (((dynamic_info.discard_rectangle_mode & 1U) == 0) &&
           (pVVar6->pSampleMask != (VkSampleMask *)0x0)) {
          VVar1 = pVVar6->rasterizationSamples;
          for (vp._0_4_ = 0;
              (uint)vp <
              (uint)((int)(VVar1 + (VK_SAMPLE_COUNT_16_BIT|VK_SAMPLE_COUNT_8_BIT|
                                    VK_SAMPLE_COUNT_4_BIT|VK_SAMPLE_COUNT_2_BIT|
                                   VK_SAMPLE_COUNT_1_BIT)) / 0x20); vp._0_4_ = (uint)vp + 1) {
            Hasher::u32((Hasher *)&hash,pVVar6->pSampleMask[(uint)vp]);
          }
        }
        else {
          Hasher::u32((Hasher *)&hash,0);
        }
        bVar11 = hash_pnext_chain(recorder,(Hasher *)&hash,pVVar6->pNext,
                                  (DynamicStateInfo *)local_80,h.h._4_4_);
        if (!bVar11) {
          return false;
        }
      }
      if ((local_cb & 0x10000) == 0) {
        Hasher::u32((Hasher *)&hash,0);
      }
      else {
        pVVar7 = create_info->pViewportState;
        Hasher::u32((Hasher *)&hash,pVVar7->flags);
        if ((dynamic_info.stencil_reference & 1U) == 0) {
          local_208 = pVVar7->scissorCount;
        }
        else {
          local_208 = 0;
        }
        Hasher::u32((Hasher *)&hash,local_208);
        if ((dynamic_info.stencil_write_mask & 1U) == 0) {
          local_20c = pVVar7->viewportCount;
        }
        else {
          local_20c = 0;
        }
        Hasher::u32((Hasher *)&hash,local_20c);
        if ((local_80[7] & 1U) == 0) {
          for (vi._4_4_ = 0; vi._4_4_ < pVVar7->scissorCount; vi._4_4_ = vi._4_4_ + 1) {
            Hasher::s32((Hasher *)&hash,pVVar7->pScissors[vi._4_4_].offset.x);
            Hasher::s32((Hasher *)&hash,pVVar7->pScissors[vi._4_4_].offset.y);
            Hasher::u32((Hasher *)&hash,pVVar7->pScissors[vi._4_4_].extent.width);
            Hasher::u32((Hasher *)&hash,pVVar7->pScissors[vi._4_4_].extent.height);
          }
        }
        if ((dynamic_info.stencil_compare & 1U) == 0) {
          for (vi._0_4_ = 0; (uint)vi < pVVar7->viewportCount; vi._0_4_ = (uint)vi + 1) {
            Hasher::f32((Hasher *)&hash,pVVar7->pViewports[(uint)vi].x);
            Hasher::f32((Hasher *)&hash,pVVar7->pViewports[(uint)vi].y);
            Hasher::f32((Hasher *)&hash,pVVar7->pViewports[(uint)vi].width);
            Hasher::f32((Hasher *)&hash,pVVar7->pViewports[(uint)vi].height);
            Hasher::f32((Hasher *)&hash,pVVar7->pViewports[(uint)vi].minDepth);
            Hasher::f32((Hasher *)&hash,pVVar7->pViewports[(uint)vi].maxDepth);
          }
        }
        bVar11 = hash_pnext_chain(recorder,(Hasher *)&hash,pVVar7->pNext,
                                  (DynamicStateInfo *)local_80,h.h._4_4_);
        if (!bVar11) {
          return false;
        }
      }
      if ((local_cb & 0x1000000000000) == 0) {
        Hasher::u32((Hasher *)&hash,0);
      }
      else {
        pVVar8 = create_info->pVertexInputState;
        Hasher::u32((Hasher *)&hash,pVVar8->flags);
        Hasher::u32((Hasher *)&hash,pVVar8->vertexAttributeDescriptionCount);
        Hasher::u32((Hasher *)&hash,pVVar8->vertexBindingDescriptionCount);
        for (b._4_4_ = 0; b._4_4_ < pVVar8->vertexAttributeDescriptionCount; b._4_4_ = b._4_4_ + 1)
        {
          Hasher::u32((Hasher *)&hash,pVVar8->pVertexAttributeDescriptions[b._4_4_].offset);
          Hasher::u32((Hasher *)&hash,pVVar8->pVertexAttributeDescriptions[b._4_4_].binding);
          Hasher::u32((Hasher *)&hash,pVVar8->pVertexAttributeDescriptions[b._4_4_].format);
          Hasher::u32((Hasher *)&hash,pVVar8->pVertexAttributeDescriptions[b._4_4_].location);
        }
        for (b._0_4_ = 0; (uint)b < pVVar8->vertexBindingDescriptionCount; b._0_4_ = (uint)b + 1) {
          Hasher::u32((Hasher *)&hash,pVVar8->pVertexBindingDescriptions[(uint)b].binding);
          Hasher::u32((Hasher *)&hash,pVVar8->pVertexBindingDescriptions[(uint)b].inputRate);
          if ((dynamic_info.front_face & 1U) == 0) {
            local_210 = pVVar8->pVertexBindingDescriptions[(uint)b].stride;
          }
          else {
            local_210 = 0;
          }
          Hasher::u32((Hasher *)&hash,local_210);
        }
        bVar11 = hash_pnext_chain(recorder,(Hasher *)&hash,pVVar8->pNext,
                                  (DynamicStateInfo *)local_80,h.h._4_4_);
        if (!bVar11) {
          return false;
        }
      }
      if ((local_cb & 0x10000000000) == 0) {
        Hasher::u32((Hasher *)&hash,0);
      }
      else {
        pVVar9 = create_info->pColorBlendState;
        Hasher::u32((Hasher *)&hash,pVVar9->flags);
        Hasher::u32((Hasher *)&hash,pVVar9->attachmentCount);
        if ((dynamic_info.line_stipple & 1U) == 0) {
          local_214 = pVVar9->logicOpEnable;
        }
        else {
          local_214 = 0;
        }
        Hasher::u32((Hasher *)&hash,local_214);
        if (((dynamic_info.depth_bounds_test_enable & 1U) == 0) &&
           ((pVVar9->logicOpEnable != 0 || ((dynamic_info.line_stipple & 1U) != 0)))) {
          local_218 = pVVar9->logicOp;
        }
        else {
          local_218 = VK_LOGIC_OP_CLEAR;
        }
        Hasher::u32((Hasher *)&hash,local_218);
        local_219 = 0;
        if (((dynamic_info.tessellation_domain_origin & 1U) != 0) &&
           (local_219 = 0, (dynamic_info.polygon_mode & 1U) != 0)) {
          local_219 = dynamic_info.depth_clamp_enable;
        }
        bVar11 = (dynamic_info.depth_clamp_enable & 1U) != 0;
        if ((local_219 & 1) != 0) {
          Hasher::u32((Hasher *)&hash,0);
        }
        __range4._0_4_ = 0;
        while( true ) {
          bVar15 = false;
          if ((local_219 & 1) == 0) {
            bVar15 = (uint)__range4 < pVVar9->attachmentCount;
          }
          if (!bVar15) break;
          if ((dynamic_info.tessellation_domain_origin & 1U) == 0) {
            local_220 = pVVar9->pAttachments[(uint)__range4].blendEnable;
          }
          else {
            local_220 = 0;
          }
          Hasher::u32((Hasher *)&hash,local_220);
          if ((dynamic_info.polygon_mode & 1U) == 0) {
            local_224 = pVVar9->pAttachments[(uint)__range4].colorWriteMask;
          }
          else {
            local_224 = 0;
          }
          Hasher::u32((Hasher *)&hash,local_224);
          if ((pVVar9->pAttachments[(uint)__range4].blendEnable == 0) &&
             ((dynamic_info.tessellation_domain_origin & 1U) == 0)) {
            Hasher::u32((Hasher *)&hash,0);
          }
          else {
            if ((dynamic_info.depth_clamp_enable & 1U) == 0) {
              if ((dynamic_info.color_blend_enable & 1U) == 0) {
                local_228 = pVVar9->pAttachments[(uint)__range4].alphaBlendOp;
              }
              else {
                local_228 = VK_BLEND_OP_ADD;
              }
              Hasher::u32((Hasher *)&hash,local_228);
              if ((dynamic_info.color_blend_enable & 1U) == 0) {
                local_22c = pVVar9->pAttachments[(uint)__range4].colorBlendOp;
              }
              else {
                local_22c = VK_BLEND_OP_ADD;
              }
              Hasher::u32((Hasher *)&hash,local_22c);
              Hasher::u32((Hasher *)&hash,pVVar9->pAttachments[(uint)__range4].dstAlphaBlendFactor);
              Hasher::u32((Hasher *)&hash,pVVar9->pAttachments[(uint)__range4].srcAlphaBlendFactor);
              Hasher::u32((Hasher *)&hash,pVVar9->pAttachments[(uint)__range4].dstColorBlendFactor);
              Hasher::u32((Hasher *)&hash,pVVar9->pAttachments[(uint)__range4].srcColorBlendFactor);
            }
            else {
              Hasher::u32((Hasher *)&hash,0);
            }
            if (((((pVVar9->pAttachments[(uint)__range4].dstAlphaBlendFactor ==
                    VK_BLEND_FACTOR_CONSTANT_ALPHA) ||
                  (pVVar9->pAttachments[(uint)__range4].dstAlphaBlendFactor ==
                   VK_BLEND_FACTOR_CONSTANT_COLOR)) ||
                 (pVVar9->pAttachments[(uint)__range4].srcAlphaBlendFactor ==
                  VK_BLEND_FACTOR_CONSTANT_ALPHA)) ||
                ((pVVar9->pAttachments[(uint)__range4].srcAlphaBlendFactor ==
                  VK_BLEND_FACTOR_CONSTANT_COLOR ||
                 (pVVar9->pAttachments[(uint)__range4].dstColorBlendFactor ==
                  VK_BLEND_FACTOR_CONSTANT_ALPHA)))) ||
               ((pVVar9->pAttachments[(uint)__range4].dstColorBlendFactor ==
                 VK_BLEND_FACTOR_CONSTANT_COLOR ||
                ((pVVar9->pAttachments[(uint)__range4].srcColorBlendFactor ==
                  VK_BLEND_FACTOR_CONSTANT_ALPHA ||
                 (pVVar9->pAttachments[(uint)__range4].srcColorBlendFactor ==
                  VK_BLEND_FACTOR_CONSTANT_COLOR)))))) {
              bVar11 = true;
            }
          }
          __range4._0_4_ = (uint)__range4 + 1;
        }
        if ((bVar11) && ((local_80[6] & 1U) == 0)) {
          for (__end4 = pVVar9->blendConstants;
              (VkPipelineColorBlendStateCreateInfo *)__end4 != pVVar9 + 1; __end4 = __end4 + 1) {
            Hasher::f32((Hasher *)&hash,*__end4);
          }
        }
        bVar11 = hash_pnext_chain(recorder,(Hasher *)&hash,pVVar9->pNext,
                                  (DynamicStateInfo *)local_80,h.h._4_4_);
        if (!bVar11) {
          return false;
        }
      }
      if ((local_cb & 0x100) == 0) {
        Hasher::u32((Hasher *)&hash,0);
      }
      else {
        pVVar10 = create_info->pTessellationState;
        Hasher::u32((Hasher *)&hash,pVVar10->flags);
        if ((dynamic_info.depth_test_enable & 1U) == 0) {
          local_230 = pVVar10->patchControlPoints;
        }
        else {
          local_230 = 0;
        }
        Hasher::u32((Hasher *)&hash,local_230);
        bVar11 = hash_pnext_chain(recorder,(Hasher *)&hash,pVVar10->pNext,
                                  (DynamicStateInfo *)local_80,h.h._4_4_);
        if (!bVar11) {
          return false;
        }
      }
      if ((global_info.viewport_state & 1U) != 0) {
        for (stage._4_4_ = 0; stage._4_4_ < create_info->stageCount; stage._4_4_ = stage._4_4_ + 1)
        {
          bVar11 = compute_hash_stage(recorder,(Hasher *)&hash,create_info->pStages + stage._4_4_);
          if (!bVar11) {
            return false;
          }
        }
      }
      bVar11 = hash_pnext_chain(recorder,(Hasher *)&hash,create_info->pNext,
                                (DynamicStateInfo *)local_80,h.h._4_4_);
      if (bVar11) {
        HVar14 = Hasher::get((Hasher *)&hash);
        *out_hash = HVar14;
        recorder_local._7_1_ = true;
      }
      else {
        recorder_local._7_1_ = false;
      }
    }
    else {
      recorder_local._7_1_ = false;
    }
  }
  else {
    recorder_local._7_1_ = false;
  }
  return recorder_local._7_1_;
}

Assistant:

bool compute_hash_graphics_pipeline(const StateRecorder &recorder, const VkGraphicsPipelineCreateInfo &create_info, Hash *out_hash)
{
	// Ignore pipelines that cannot result in meaningful replay.
	auto state_flags = graphics_pipeline_get_effective_state_flags(create_info);

	Hasher h;
	Hash hash;

	if (find_pnext<VkPipelineCreateFlags2CreateInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR, create_info.pNext))
		h.u32(0);
	else
		h.u32(normalize_pipeline_creation_flags(create_info.flags));

	if ((create_info.flags & VK_PIPELINE_CREATE_DERIVATIVE_BIT) != 0 &&
	    create_info.basePipelineHandle != VK_NULL_HANDLE)
	{
		if (!recorder.get_hash_for_graphics_pipeline_handle(create_info.basePipelineHandle, &hash))
			return false;
		h.u64(hash);
		h.s32(create_info.basePipelineIndex);
	}

	DynamicStateInfo dynamic_info = {};
	if (create_info.pDynamicState)
		dynamic_info = parse_dynamic_state_info(*create_info.pDynamicState);
	GlobalStateInfo global_info = parse_global_state_info(create_info, dynamic_info, { true, true });

	if (global_info.layout_state)
	{
		if (!recorder.get_hash_for_pipeline_layout(create_info.layout, &hash))
			return false;
	}
	else
		hash = 0;

	h.u64(hash);

	// Need to query state info in two stages. Do we ignore render pass? If so, query a 0 hash.
	// If we don't ignore render pass, we can query for subpass meta.
	hash = 0;
	if (global_info.render_pass_state && !recorder.get_hash_for_render_pass(create_info.renderPass, &hash))
		return false;
	h.u64(hash);

	StateRecorder::SubpassMeta meta = {};
	if (!recorder.get_subpass_meta_for_pipeline(create_info, hash, &meta))
		return false;

	global_info = parse_global_state_info(create_info, dynamic_info, meta);

	h.u32(global_info.render_pass_state ? create_info.subpass : 0u);
	h.u32(global_info.module_state ? create_info.stageCount : 0u);

	if (create_info.pDynamicState)
	{
		auto &state = *create_info.pDynamicState;
		h.u32(state.dynamicStateCount);
		h.u32(state.flags);
		for (uint32_t i = 0; i < state.dynamicStateCount; i++)
			h.u32(state.pDynamicStates[i]);
		if (!hash_pnext_chain(&recorder, h, state.pNext, &dynamic_info, state_flags))
			return false;
	}
	else
		h.u32(0);

	if (global_info.depth_stencil_state)
	{
		auto &ds = *create_info.pDepthStencilState;
		h.u32(ds.flags);
		h.u32(dynamic_info.depth_bounds_test_enable ? 0 : ds.depthBoundsTestEnable);
		h.u32(dynamic_info.depth_compare_op ? 0 : ds.depthCompareOp);
		h.u32(dynamic_info.depth_test_enable ? 0 : ds.depthTestEnable);
		h.u32(dynamic_info.depth_write_enable ? 0 : ds.depthWriteEnable);
		h.u32(dynamic_info.stencil_op ? 0 : ds.front.compareOp);
		h.u32(dynamic_info.stencil_op ? 0 : ds.front.depthFailOp);
		h.u32(dynamic_info.stencil_op ? 0 : ds.front.failOp);
		h.u32(dynamic_info.stencil_op ? 0 : ds.front.passOp);
		h.u32(dynamic_info.stencil_op ? 0 : ds.back.compareOp);
		h.u32(dynamic_info.stencil_op ? 0 : ds.back.depthFailOp);
		h.u32(dynamic_info.stencil_op ? 0 : ds.back.failOp);
		h.u32(dynamic_info.stencil_op ? 0 : ds.back.passOp);
		h.u32(dynamic_info.stencil_test_enable ? 0 : ds.stencilTestEnable);

		if (!dynamic_info.depth_bounds && (ds.depthBoundsTestEnable || dynamic_info.depth_bounds_test_enable))
		{
			h.f32(ds.minDepthBounds);
			h.f32(ds.maxDepthBounds);
		}

		if (ds.stencilTestEnable || dynamic_info.stencil_test_enable)
		{
			if (!dynamic_info.stencil_compare)
			{
				h.u32(ds.front.compareMask);
				h.u32(ds.back.compareMask);
			}

			if (!dynamic_info.stencil_reference)
			{
				h.u32(ds.front.reference);
				h.u32(ds.back.reference);
			}

			if (!dynamic_info.stencil_write_mask)
			{
				h.u32(ds.front.writeMask);
				h.u32(ds.back.writeMask);
			}
		}

		if (!hash_pnext_chain(&recorder, h, ds.pNext, &dynamic_info, state_flags))
			return false;
	}
	else
		h.u32(0);

	if (global_info.input_assembly)
	{
		auto &ia = *create_info.pInputAssemblyState;
		h.u32(ia.flags);
		h.u32(dynamic_info.primitive_restart_enable ? 0 : ia.primitiveRestartEnable);
		// Dynamic 3 makes this fully ignored, but it depends on a property. For sanity's sake we need to hash this.
		h.u32(ia.topology);

		if (!hash_pnext_chain(&recorder, h, ia.pNext, &dynamic_info, state_flags))
			return false;
	}
	else
		h.u32(0);

	if (global_info.rasterization_state)
	{
		auto &rs = *create_info.pRasterizationState;
		h.u32(rs.flags);
		h.u32(dynamic_info.cull_mode ? 0 : rs.cullMode);
		h.u32(dynamic_info.depth_clamp_enable ? 0 : rs.depthClampEnable);
		h.u32(dynamic_info.front_face ? 0 : rs.frontFace);
		h.u32(dynamic_info.rasterizer_discard_enable ? 0 : rs.rasterizerDiscardEnable);
		h.u32(dynamic_info.polygon_mode ? 0 : rs.polygonMode);
		h.u32(dynamic_info.depth_bias_enable ? 0 : rs.depthBiasEnable);

		if ((rs.depthBiasEnable || dynamic_info.depth_bias_enable) && !dynamic_info.depth_bias)
		{
			h.f32(rs.depthBiasClamp);
			h.f32(rs.depthBiasSlopeFactor);
			h.f32(rs.depthBiasConstantFactor);
		}

		if (!dynamic_info.line_width)
			h.f32(rs.lineWidth);

		if (!hash_pnext_chain(&recorder, h, rs.pNext, &dynamic_info, state_flags))
			return false;
	}
	else
		h.u32(0);

	if (global_info.multisample_state)
	{
		auto &ms = *create_info.pMultisampleState;
		h.u32(ms.flags);
		h.u32(dynamic_info.alpha_to_coverage_enable ? 0 : ms.alphaToCoverageEnable);
		h.u32(dynamic_info.alpha_to_one_enable ? 0 : ms.alphaToOneEnable);
		h.f32(ms.minSampleShading);
		h.u32(dynamic_info.rasterization_samples ? 0 : ms.rasterizationSamples);
		h.u32(ms.sampleShadingEnable);
		if (!dynamic_info.sample_mask && ms.pSampleMask)
		{
			uint32_t elems = (ms.rasterizationSamples + 31) / 32;
			for (uint32_t i = 0; i < elems; i++)
				h.u32(ms.pSampleMask[i]);
		}
		else
			h.u32(0);

		if (!hash_pnext_chain(&recorder, h, ms.pNext, &dynamic_info, state_flags))
			return false;
	}

	if (global_info.viewport_state)
	{
		auto &vp = *create_info.pViewportState;
		h.u32(vp.flags);
		h.u32(dynamic_info.scissor_count ? 0 : vp.scissorCount);
		h.u32(dynamic_info.viewport_count ? 0 : vp.viewportCount);

		if (!dynamic_info.scissor)
		{
			for (uint32_t i = 0; i < vp.scissorCount; i++)
			{
				h.s32(vp.pScissors[i].offset.x);
				h.s32(vp.pScissors[i].offset.y);
				h.u32(vp.pScissors[i].extent.width);
				h.u32(vp.pScissors[i].extent.height);
			}
		}

		if (!dynamic_info.viewport)
		{
			for (uint32_t i = 0; i < vp.viewportCount; i++)
			{
				h.f32(vp.pViewports[i].x);
				h.f32(vp.pViewports[i].y);
				h.f32(vp.pViewports[i].width);
				h.f32(vp.pViewports[i].height);
				h.f32(vp.pViewports[i].minDepth);
				h.f32(vp.pViewports[i].maxDepth);
			}
		}

		if (!hash_pnext_chain(&recorder, h, vp.pNext, &dynamic_info, state_flags))
			return false;
	}
	else
		h.u32(0);

	if (global_info.vertex_input)
	{
		auto &vi = *create_info.pVertexInputState;
		h.u32(vi.flags);
		h.u32(vi.vertexAttributeDescriptionCount);
		h.u32(vi.vertexBindingDescriptionCount);

		for (uint32_t i = 0; i < vi.vertexAttributeDescriptionCount; i++)
		{
			h.u32(vi.pVertexAttributeDescriptions[i].offset);
			h.u32(vi.pVertexAttributeDescriptions[i].binding);
			h.u32(vi.pVertexAttributeDescriptions[i].format);
			h.u32(vi.pVertexAttributeDescriptions[i].location);
		}

		for (uint32_t i = 0; i < vi.vertexBindingDescriptionCount; i++)
		{
			h.u32(vi.pVertexBindingDescriptions[i].binding);
			h.u32(vi.pVertexBindingDescriptions[i].inputRate);
			h.u32(dynamic_info.vertex_input_binding_stride ? 0 : vi.pVertexBindingDescriptions[i].stride);
		}

		if (!hash_pnext_chain(&recorder, h, vi.pNext, &dynamic_info, state_flags))
			return false;
	}
	else
		h.u32(0);

	if (global_info.color_blend_state)
	{
		auto &b = *create_info.pColorBlendState;
		h.u32(b.flags);
		h.u32(b.attachmentCount);
		h.u32(dynamic_info.logic_op_enable ? 0 : b.logicOpEnable);
		h.u32(dynamic_info.logic_op || (!b.logicOpEnable && !dynamic_info.logic_op_enable) ? 0 : b.logicOp);

		bool need_blend_constants = false;

		// Special EDS3 rule. If all of these are set, we must ignore the pAttachments pointer.
		const bool dynamic_attachments = dynamic_info.color_blend_enable &&
		                                 dynamic_info.color_write_mask &&
		                                 dynamic_info.color_blend_equation;

		// If we have dynamic equation, but not dynamic blend constants, we can dynamically set blend constant
		// as input, so we might need to know those constants to hash the PSO.
		if (dynamic_info.color_blend_equation)
			need_blend_constants = true;

		if (dynamic_attachments)
			h.u32(0);

		for (uint32_t i = 0; !dynamic_attachments && i < b.attachmentCount; i++)
		{
			h.u32(dynamic_info.color_blend_enable ? 0 : b.pAttachments[i].blendEnable);
			h.u32(dynamic_info.color_write_mask ? 0 : b.pAttachments[i].colorWriteMask);
			if (b.pAttachments[i].blendEnable || dynamic_info.color_blend_enable)
			{
				if (!dynamic_info.color_blend_equation)
				{
					h.u32(dynamic_info.color_blend_advanced ? 0 : b.pAttachments[i].alphaBlendOp);
					h.u32(dynamic_info.color_blend_advanced ? 0 : b.pAttachments[i].colorBlendOp);
					h.u32(b.pAttachments[i].dstAlphaBlendFactor);
					h.u32(b.pAttachments[i].srcAlphaBlendFactor);
					h.u32(b.pAttachments[i].dstColorBlendFactor);
					h.u32(b.pAttachments[i].srcColorBlendFactor);
				}
				else
					h.u32(0);

				if (b.pAttachments[i].dstAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
				    b.pAttachments[i].dstAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR ||
				    b.pAttachments[i].srcAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
				    b.pAttachments[i].srcAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR ||
				    b.pAttachments[i].dstColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
				    b.pAttachments[i].dstColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR ||
				    b.pAttachments[i].srcColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
				    b.pAttachments[i].srcColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR)
				{
					need_blend_constants = true;
				}
			}
			else
				h.u32(0);
		}

		if (need_blend_constants && !dynamic_info.blend_constants)
			for (auto &blend_const : b.blendConstants)
				h.f32(blend_const);

		if (!hash_pnext_chain(&recorder, h, b.pNext, &dynamic_info, state_flags))
			return false;
	}
	else
		h.u32(0);

	if (global_info.tessellation_state)
	{
		auto &tess = *create_info.pTessellationState;
		h.u32(tess.flags);
		h.u32(dynamic_info.patch_control_points ? 0 : tess.patchControlPoints);

		if (!hash_pnext_chain(&recorder, h, tess.pNext, &dynamic_info, state_flags))
			return false;
	}
	else
		h.u32(0);

	if (global_info.module_state)
	{
		for (uint32_t i = 0; i < create_info.stageCount; i++)
		{
			auto &stage = create_info.pStages[i];
			if (!compute_hash_stage(recorder, h, stage))
				return false;
		}
	}

	if (!hash_pnext_chain(&recorder, h, create_info.pNext, &dynamic_info, state_flags))
		return false;

	*out_hash = h.get();
	return true;
}